

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FloatStateQueryVerifiers::GetFloatVerifier::verifyFloatRange
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLfloat min,GLfloat max)

{
  ostringstream *this_00;
  bool bVar1;
  StateQueryMemoryWriteGuard<float[2]> floatVector2;
  StateQueryMemoryWriteGuard<float[2]> local_1a8;
  undefined1 local_190 [384];
  
  local_1a8.m_postguard[0] = -8.0297587e+18;
  local_1a8.m_postguard[1] = -8.0297587e+18;
  local_1a8.m_preguard[0] = -8.0297587e+18;
  local_1a8.m_preguard[1] = -8.0297587e+18;
  local_1a8.m_value[0] = -8.0297587e+18;
  local_1a8.m_value[1] = -8.0297587e+18;
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1a8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[2]>::verifyValidity
                    (&local_1a8,testCtx);
  if ((bVar1) && ((min < local_1a8.m_value[0] || (local_1a8.m_value[1] < max)))) {
    local_190._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected in range [",0x1d);
    std::ostream::_M_insert<double>((double)min);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<double>((double)max);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]; got [",8);
    std::ostream::_M_insert<double>((double)local_1a8.m_value[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    std::ostream::_M_insert<double>((double)local_1a8.m_value[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float range");
    }
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyFloatRange (tcu::TestContext& testCtx, GLenum name, GLfloat min, GLfloat max)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[2]> floatVector2;
	glGetFloatv(name, floatVector2);

	if (!floatVector2.verifyValidity(testCtx))
		return;

	if (floatVector2[0] > min ||
		floatVector2[1] < max)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected in range [" << min << ", " << max << "]; got [" << floatVector2[0] << " " << floatVector2[1]  << "]" << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float range");
	}
}